

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

String * __thiscall
Rml::DataViewText::BuildText_abi_cxx11_(String *__return_storage_ptr__,DataViewText *this)

{
  bool bVar1;
  Vector<DataEntry> *pVVar2;
  string local_c0 [32];
  string local_a0 [32];
  reference local_80;
  DataEntry *entry_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  Vector<DataEntry> *__range1_1;
  size_t previous_index;
  DataEntry *entry;
  const_iterator __end1;
  const_iterator __begin1;
  Vector<DataEntry> *__range1;
  size_t reserve_size;
  DataViewText *this_local;
  String *result;
  
  ::std::__cxx11::string::size();
  __end1 = ::std::
           vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>::
           begin(&this->data_entries);
  entry = (DataEntry *)
          ::std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>
          ::end(&this->data_entries);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_Rml::DataViewText::DataEntry_*,_std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>_>
                                     *)&entry), bVar1) {
    __gnu_cxx::
    __normal_iterator<const_Rml::DataViewText::DataEntry_*,_std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>_>
    ::operator*(&__end1);
    ::std::__cxx11::string::size();
    __gnu_cxx::
    __normal_iterator<const_Rml::DataViewText::DataEntry_*,_std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>_>
    ::operator++(&__end1);
  }
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __range1_1 = (Vector<DataEntry> *)0x0;
  __end1_1 = ::std::
             vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>::
             begin(&this->data_entries);
  entry_1 = (DataEntry *)
            ::std::
            vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>::end
                      (&this->data_entries);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_Rml::DataViewText::DataEntry_*,_std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>_>
                             *)&entry_1), bVar1) {
    local_80 = __gnu_cxx::
               __normal_iterator<const_Rml::DataViewText::DataEntry_*,_std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>_>
               ::operator*(&__end1_1);
    ::std::__cxx11::string::substr((ulong)local_a0,(ulong)&this->text);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_a0);
    ::std::__cxx11::string::~string(local_a0);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_80->value);
    __range1_1 = (Vector<DataEntry> *)local_80->index;
    __gnu_cxx::
    __normal_iterator<const_Rml::DataViewText::DataEntry_*,_std::vector<Rml::DataViewText::DataEntry,_std::allocator<Rml::DataViewText::DataEntry>_>_>
    ::operator++(&__end1_1);
  }
  pVVar2 = (Vector<DataEntry> *)::std::__cxx11::string::size();
  if (__range1_1 < pVVar2) {
    ::std::__cxx11::string::substr((ulong)local_c0,(ulong)&this->text);
    ::std::__cxx11::string::operator+=((string *)__return_storage_ptr__,local_c0);
    ::std::__cxx11::string::~string(local_c0);
  }
  return __return_storage_ptr__;
}

Assistant:

String DataViewText::BuildText() const
{
	size_t reserve_size = text.size();

	for (const DataEntry& entry : data_entries)
		reserve_size += entry.value.size();

	String result;
	result.reserve(reserve_size);

	size_t previous_index = 0;
	for (const DataEntry& entry : data_entries)
	{
		result += text.substr(previous_index, entry.index - previous_index);
		result += entry.value;
		previous_index = entry.index;
	}

	if (previous_index < text.size())
		result += text.substr(previous_index);

	return result;
}